

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O0

IAnimatedMesh * __thiscall
irr::scene::COBJMeshFileLoader::createMesh(COBJMeshFileLoader *this,IReadFile *file)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  u32 uVar4;
  int iVar5;
  SObjMtl *pSVar6;
  long *plVar7;
  char *pcVar8;
  vector3d<float> *pvVar9;
  vector2d<float> *pvVar10;
  pointer ppVar11;
  int *piVar12;
  Printer *this_00;
  undefined8 *puVar13;
  SObjMtl **ppSVar14;
  long *in_RSI;
  long in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  pair<std::_Rb_tree_iterator<std::pair<const_irr::video::S3DVertex,_int>_>,_bool> pVar15;
  SAnimatedMesh *animMesh;
  u32 m;
  SMesh *mesh;
  stringc log;
  int b;
  int a;
  u32 i;
  int c;
  iterator n;
  int vertLocation;
  u32 wlength;
  s32 Idx [3];
  c8 *endPtr;
  c8 *linePtr;
  stringc wordBuffer;
  SObjMtl *useMtl;
  S3DVertex v;
  c8 vertexWord [512];
  c8 matName [512];
  c8 smooth [512];
  c8 grp [512];
  vector2df vec_2;
  vector3df vec_1;
  vector3df vec;
  c8 name [512];
  u32 degeneratedFaces;
  stringc TAG_OFF;
  array<int> faceCorners;
  u32 lineNr;
  bool useMaterials;
  bool useGroups;
  bool mtlChanged;
  stringc mtlName;
  stringc grpName;
  c8 *bufPtr;
  c8 *bufEnd;
  c8 *buf;
  path fullName;
  u32 smoothingGroup;
  SObjMtl *currMtl;
  array<irr::core::vector2d<float>_> textureCoordBuffer;
  array<irr::core::vector3d<float>_> normalsBuffer;
  array<irr::core::vector3d<float>_> vertexBuffer;
  u32 WORD_BUFFER_LENGTH;
  long filesize;
  u32 in_stack_fffffffffffff2c8;
  u32 in_stack_fffffffffffff2cc;
  undefined4 in_stack_fffffffffffff2d0;
  E_ANIMATED_MESH_TYPE in_stack_fffffffffffff2d4;
  S3DVertex *in_stack_fffffffffffff2d8;
  SAnimatedMesh *in_stack_fffffffffffff2e0;
  COBJMeshFileLoader *in_stack_fffffffffffff2e8;
  COBJMeshFileLoader *in_stack_fffffffffffff2f0;
  u32 in_stack_fffffffffffff2f8;
  u32 in_stack_fffffffffffff2fc;
  uint uVar16;
  c8 *in_stack_fffffffffffff300;
  undefined4 in_stack_fffffffffffff308;
  uint in_stack_fffffffffffff30c;
  SObjMtl *in_stack_fffffffffffff310;
  int in_stack_fffffffffffff318;
  int in_stack_fffffffffffff31c;
  undefined4 in_stack_fffffffffffff328;
  int in_stack_fffffffffffff32c;
  stringc *in_stack_fffffffffffff330;
  COBJMeshFileLoader *in_stack_fffffffffffff338;
  SAnimatedMesh *local_c90;
  uint local_c84;
  uint in_stack_fffffffffffff3d8;
  int in_stack_fffffffffffff3dc;
  _Rb_tree_iterator<std::pair<const_irr::video::S3DVertex,_int>_> in_stack_fffffffffffff3e0;
  undefined1 in_stack_fffffffffffff3e8;
  undefined7 in_stack_fffffffffffff3e9;
  iterator in_stack_fffffffffffff3f0;
  _Self local_c08;
  int local_c00;
  int local_bfc;
  u32 local_bf8;
  undefined1 local_bf4 [20];
  char *local_be0;
  SObjMtl *local_bb8;
  undefined8 local_bac;
  float local_ba4;
  vector3d<float> local_ba0;
  u32 local_b94;
  vector2d<float> local_b90;
  stringc local_b88 [32];
  char local_788 [512];
  char local_588;
  vector2d<float> local_388;
  vector3d<float> local_380;
  vector3d<float> local_374 [44];
  int local_15c;
  int local_118;
  byte local_113;
  byte local_112;
  byte local_111;
  SObjMtl *local_d0;
  SObjMtl *local_c8;
  SObjMtl *local_c0;
  u32 local_94;
  SObjMtl *local_90;
  undefined4 local_24;
  long local_20;
  long *local_18;
  SAnimatedMesh *local_8;
  
  if (in_RSI == (long *)0x0) {
    local_8 = (SAnimatedMesh *)0x0;
  }
  else {
    local_18 = in_RSI;
    local_20 = (**(code **)(*in_RSI + 0x10))();
    if (local_20 == 0) {
      local_8 = (SAnimatedMesh *)0x0;
    }
    else {
      local_24 = 0x200;
      core::array<irr::core::vector3d<float>_>::array
                ((array<irr::core::vector3d<float>_> *)
                 CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                 in_stack_fffffffffffff2cc);
      core::array<irr::core::vector3d<float>_>::array
                ((array<irr::core::vector3d<float>_> *)
                 CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                 in_stack_fffffffffffff2cc);
      core::array<irr::core::vector2d<float>_>::array
                ((array<irr::core::vector2d<float>_> *)
                 CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                 in_stack_fffffffffffff2cc);
      pSVar6 = (SObjMtl *)operator_new(0x80);
      SObjMtl::SObjMtl(in_stack_fffffffffffff310);
      local_90 = pSVar6;
      core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::push_back
                ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)
                 CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                 (SObjMtl **)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
      local_94 = 0;
      (**(code **)(*local_18 + 0x20))();
      core::string<char>::string
                ((string<char> *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                 (string<char> *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
      local_c0 = (SObjMtl *)operator_new__(local_20 + 1);
      memset(local_c0,0,local_20 + 1);
      (**(code **)*local_18)(local_18,local_c0,local_20);
      local_c8 = (SObjMtl *)(&(local_c0->VertMap)._M_t._M_impl.field_0x0 + local_20);
      local_d0 = local_c0;
      core::string<char>::string((string<char> *)0x2d8ac8);
      core::string<char>::string((string<char> *)0x2d8ad5);
      local_111 = 0;
      plVar7 = (long *)(**(code **)(**(long **)(in_RDI + 8) + 0xd8))();
      bVar2 = (**(code **)(*plVar7 + 0x98))(plVar7,"OBJ_IgnoreGroups",0);
      local_112 = (bVar2 ^ 0xff) & 1;
      plVar7 = (long *)(**(code **)(**(long **)(in_RDI + 8) + 0xd8))();
      bVar2 = (**(code **)(*plVar7 + 0x98))(plVar7,"OBJ_IgnoreMaterialFiles",0);
      local_113 = (bVar2 ^ 0xff) & 1;
      local_118 = 1;
      core::array<int>::array
                ((array<int> *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
      core::array<int>::reallocate
                ((array<int> *)in_stack_fffffffffffff2e0,
                 (u32)((ulong)in_stack_fffffffffffff2d8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff2d8 >> 0x18,0));
      core::string<char>::string<char>
                ((string<char> *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                 (char *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
      local_15c = 0;
      while (local_d0 != local_c8) {
        cVar1 = *(char *)&(local_d0->VertMap)._M_t._M_impl;
        if (cVar1 != '#') {
          if (cVar1 == 'f') {
            video::S3DVertex::S3DVertex
                      ((S3DVertex *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
            if ((local_111 & 1) != 0) {
              local_bb8 = findMtl(in_stack_fffffffffffff338,in_stack_fffffffffffff330,
                                  (stringc *)
                                  CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
              if (local_bb8 != (SObjMtl *)0x0) {
                local_90 = local_bb8;
              }
              local_111 = 0;
            }
            if (local_90 != (SObjMtl *)0x0) {
              local_b94 = (local_90->Meshbuffer->Material).DiffuseColor.color;
            }
            copyLine(in_stack_fffffffffffff2e8,(c8 *)in_stack_fffffffffffff2e0,
                     (c8 *)in_stack_fffffffffffff2d8);
            pcVar8 = core::string<char>::c_str((string<char> *)0x2d8fae);
            local_be0 = pcVar8;
            uVar4 = core::string<char>::size((string<char> *)0x2d8fd3);
            local_bf4._12_8_ = pcVar8 + uVar4;
            core::array<int>::set_used
                      ((array<int> *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                       in_stack_fffffffffffff2cc);
            local_be0 = goNextWord(in_stack_fffffffffffff2f0,(c8 *)in_stack_fffffffffffff2e8,
                                   (c8 *)in_stack_fffffffffffff2e0,
                                   SUB81((ulong)in_stack_fffffffffffff2d8 >> 0x38,0));
            while (*local_be0 != '\0') {
              local_bf4._8_4_ = -1;
              local_bf4._4_4_ = -1;
              local_bf4._0_4_ = -1;
              local_bf8 = copyWord((COBJMeshFileLoader *)
                                   CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8),
                                   (c8 *)in_stack_fffffffffffff2f0,(c8 *)in_stack_fffffffffffff2e8,
                                   (u32)((ulong)in_stack_fffffffffffff2e0 >> 0x20),
                                   (c8 *)in_stack_fffffffffffff2d8);
              in_stack_fffffffffffff330 = local_b88;
              in_stack_fffffffffffff338 = (COBJMeshFileLoader *)local_bf4;
              core::array<irr::core::vector3d<float>_>::size
                        ((array<irr::core::vector3d<float>_> *)0x2d90cc);
              core::array<irr::core::vector2d<float>_>::size
                        ((array<irr::core::vector2d<float>_> *)0x2d90e0);
              in_stack_fffffffffffff2c8 =
                   core::array<irr::core::vector3d<float>_>::size
                             ((array<irr::core::vector3d<float>_> *)0x2d90f4);
              retrieveVertexIndices
                        ((COBJMeshFileLoader *)
                         CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318),
                         (c8 *)in_stack_fffffffffffff310,
                         (s32 *)CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),
                         in_stack_fffffffffffff300,in_stack_fffffffffffff2fc,
                         in_stack_fffffffffffff2f8,(u32)in_stack_fffffffffffff330);
              if (((int)local_bf4._0_4_ < 0) ||
                 (in_stack_fffffffffffff32c = local_bf4._0_4_,
                 uVar4 = core::array<irr::core::vector3d<float>_>::size
                                   ((array<irr::core::vector3d<float>_> *)0x2d9145),
                 (int)uVar4 <= in_stack_fffffffffffff32c)) {
                core::string<char>::c_str((string<char> *)0x2d9187);
                os::Printer::log(__x);
                if (local_c0 != (SObjMtl *)0x0) {
                  operator_delete__(local_c0);
                }
                cleanUp((COBJMeshFileLoader *)in_stack_fffffffffffff2e0);
                local_8 = (SAnimatedMesh *)0x0;
                local_bfc = 1;
                goto LAB_002d95db;
              }
              pvVar9 = core::array<irr::core::vector3d<float>_>::operator[]
                                 ((array<irr::core::vector3d<float>_> *)
                                  CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                  in_stack_fffffffffffff2cc);
              local_bac._0_4_ = pvVar9->X;
              local_bac._4_4_ = pvVar9->Y;
              local_ba4 = pvVar9->Z;
              if (((int)local_bf4._4_4_ < 0) ||
                 (in_stack_fffffffffffff31c = local_bf4._4_4_,
                 uVar4 = core::array<irr::core::vector2d<float>_>::size
                                   ((array<irr::core::vector2d<float>_> *)0x2d9203),
                 (int)uVar4 <= in_stack_fffffffffffff31c)) {
                core::vector2d<float>::set(&local_b90,0.0,0.0);
              }
              else {
                pvVar10 = core::array<irr::core::vector2d<float>_>::operator[]
                                    ((array<irr::core::vector2d<float>_> *)
                                     CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                     in_stack_fffffffffffff2cc);
                local_b90 = *pvVar10;
              }
              if (((int)local_bf4._8_4_ < 0) ||
                 (in_stack_fffffffffffff318 = local_bf4._8_4_,
                 uVar4 = core::array<irr::core::vector3d<float>_>::size
                                   ((array<irr::core::vector3d<float>_> *)0x2d9267),
                 (int)uVar4 <= in_stack_fffffffffffff318)) {
                core::vector3d<float>::set(&local_ba0,0.0,0.0,0.0);
                local_90->RecalculateNormals = true;
              }
              else {
                pvVar9 = core::array<irr::core::vector3d<float>_>::operator[]
                                   ((array<irr::core::vector3d<float>_> *)
                                    CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                    in_stack_fffffffffffff2cc);
                local_ba0.X = pvVar9->X;
                local_ba0.Y = pvVar9->Y;
                local_ba0.Z = pvVar9->Z;
              }
              local_c08._M_node =
                   (_Base_ptr)
                   ::std::
                   map<irr::video::S3DVertex,_int,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                   ::find((map<irr::video::S3DVertex,_int,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                          (key_type *)0x2d92d7);
              in_stack_fffffffffffff3f0 =
                   ::std::
                   map<irr::video::S3DVertex,_int,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                   ::end((map<irr::video::S3DVertex,_int,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
              bVar3 = ::std::operator!=(&local_c08,(_Self *)&stack0xfffffffffffff3f0);
              if (bVar3) {
                ppVar11 = ::std::_Rb_tree_iterator<std::pair<const_irr::video::S3DVertex,_int>_>::
                          operator->((_Rb_tree_iterator<std::pair<const_irr::video::S3DVertex,_int>_>
                                      *)0x2d931c);
                local_c00 = ppVar11->second;
              }
              else {
                core::array<irr::video::S3DVertex>::push_back
                          ((array<irr::video::S3DVertex> *)
                           CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                           (S3DVertex *)
                           CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
                uVar4 = core::array<irr::video::S3DVertex>::size
                                  ((array<irr::video::S3DVertex> *)0x2d9360);
                local_c00 = uVar4 - 1;
                pVar15 = ::std::
                         map<irr::video::S3DVertex,int,std::less<irr::video::S3DVertex>,std::allocator<std::pair<irr::video::S3DVertex_const,int>>>
                         ::emplace<irr::video::S3DVertex&,int&>
                                   ((map<irr::video::S3DVertex,_int,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                                     *)in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,
                                    (int *)CONCAT44(in_stack_fffffffffffff2d4,
                                                    in_stack_fffffffffffff2d0));
                in_stack_fffffffffffff3e0 = pVar15.first._M_node;
                in_stack_fffffffffffff3e8 = pVar15.second;
              }
              core::array<int>::push_back
                        ((array<int> *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0)
                         ,(int *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
              local_be0 = goNextWord(in_stack_fffffffffffff2f0,(c8 *)in_stack_fffffffffffff2e8,
                                     (c8 *)in_stack_fffffffffffff2e0,
                                     SUB81((ulong)in_stack_fffffffffffff2d8 >> 0x38,0));
            }
            uVar4 = core::array<int>::size((array<int> *)0x2d93e7);
            if (uVar4 < 3) {
              core::string<char>::c_str((string<char> *)0x2d93f9);
              os::Printer::log(__x_00);
              in_stack_fffffffffffff310 = local_c0;
              if (local_c0 != (SObjMtl *)0x0) {
                operator_delete__(local_c0);
              }
              cleanUp((COBJMeshFileLoader *)in_stack_fffffffffffff2e0);
              local_8 = (SAnimatedMesh *)0x0;
              local_bfc = 1;
            }
            else {
              piVar12 = core::array<int>::operator[]
                                  ((array<int> *)
                                   CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                   in_stack_fffffffffffff2cc);
              in_stack_fffffffffffff3dc = *piVar12;
              in_stack_fffffffffffff30c = 1;
              while (in_stack_fffffffffffff3d8 = in_stack_fffffffffffff30c,
                    uVar4 = core::array<int>::size((array<int> *)0x2d948e),
                    in_stack_fffffffffffff30c < uVar4 - 1) {
                piVar12 = core::array<int>::operator[]
                                    ((array<int> *)
                                     CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                     in_stack_fffffffffffff2cc);
                iVar5 = *piVar12;
                piVar12 = core::array<int>::operator[]
                                    ((array<int> *)
                                     CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                     in_stack_fffffffffffff2cc);
                if (((iVar5 == *piVar12) || (iVar5 == in_stack_fffffffffffff3dc)) ||
                   (*piVar12 == in_stack_fffffffffffff3dc)) {
                  local_15c = local_15c + 1;
                }
                else {
                  core::array<unsigned_short>::push_back
                            ((array<unsigned_short> *)
                             CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                             (unsigned_short *)
                             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
                  core::array<unsigned_short>::push_back
                            ((array<unsigned_short> *)
                             CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                             (unsigned_short *)
                             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
                  core::array<unsigned_short>::push_back
                            ((array<unsigned_short> *)
                             CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                             (unsigned_short *)
                             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
                }
                in_stack_fffffffffffff30c = in_stack_fffffffffffff3d8 + 1;
              }
              local_bfc = 0;
            }
LAB_002d95db:
            core::string<char>::~string((string<char> *)0x2d95e8);
            if (local_bfc != 0) goto LAB_002d9913;
          }
          else {
            uVar4 = (u32)((ulong)in_stack_fffffffffffff2d8 >> 0x20);
            if (cVar1 == 'g') {
              local_d0 = (SObjMtl *)
                         goAndCopyNextWord(in_stack_fffffffffffff2f0,(c8 *)in_stack_fffffffffffff2e8
                                           ,(c8 *)in_stack_fffffffffffff2e0,uVar4,
                                           (c8 *)CONCAT44(in_stack_fffffffffffff2d4,
                                                          in_stack_fffffffffffff2d0));
              if ((local_112 & 1) != 0) {
                if (local_588 == '\0') {
                  core::string<char>::operator=
                            ((string<char> *)in_stack_fffffffffffff2e8,
                             (char *)in_stack_fffffffffffff2e0);
                }
                else {
                  core::string<char>::operator=
                            ((string<char> *)in_stack_fffffffffffff2e8,
                             (char *)in_stack_fffffffffffff2e0);
                }
              }
              local_111 = 1;
            }
            else if (cVar1 == 'm') {
              if ((local_113 & 1) != 0) {
                local_d0 = (SObjMtl *)
                           goAndCopyNextWord(in_stack_fffffffffffff2f0,
                                             (c8 *)in_stack_fffffffffffff2e8,
                                             (c8 *)in_stack_fffffffffffff2e0,uVar4,
                                             (c8 *)CONCAT44(in_stack_fffffffffffff2d4,
                                                            in_stack_fffffffffffff2d0));
              }
            }
            else if (cVar1 == 's') {
              local_d0 = (SObjMtl *)
                         goAndCopyNextWord(in_stack_fffffffffffff2f0,(c8 *)in_stack_fffffffffffff2e8
                                           ,(c8 *)in_stack_fffffffffffff2e0,uVar4,
                                           (c8 *)CONCAT44(in_stack_fffffffffffff2d4,
                                                          in_stack_fffffffffffff2d0));
              bVar3 = core::string<char>::operator==
                                ((string<char> *)in_stack_fffffffffffff2d8,
                                 (char *)CONCAT44(in_stack_fffffffffffff2d4,
                                                  in_stack_fffffffffffff2d0));
              if (bVar3) {
                local_94 = 0;
              }
              else {
                local_94 = core::strtoul10(local_788,(char **)0x0);
              }
            }
            else if (cVar1 == 'u') {
              local_d0 = (SObjMtl *)
                         goAndCopyNextWord(in_stack_fffffffffffff2f0,(c8 *)in_stack_fffffffffffff2e8
                                           ,(c8 *)in_stack_fffffffffffff2e0,uVar4,
                                           (c8 *)CONCAT44(in_stack_fffffffffffff2d4,
                                                          in_stack_fffffffffffff2d0));
              core::string<char>::operator=
                        ((string<char> *)in_stack_fffffffffffff2e8,(char *)in_stack_fffffffffffff2e0
                        );
              local_111 = 1;
            }
            else if (cVar1 == 'v') {
              cVar1 = (local_d0->VertMap)._M_t._M_impl.field_0x1;
              if (cVar1 == ' ') {
                core::vector3d<float>::vector3d(local_374);
                local_d0 = (SObjMtl *)
                           readVec3((COBJMeshFileLoader *)in_stack_fffffffffffff3f0._M_node,
                                    (c8 *)CONCAT71(in_stack_fffffffffffff3e9,
                                                   in_stack_fffffffffffff3e8),
                                    (vector3df *)in_stack_fffffffffffff3e0._M_node,
                                    (c8 *)CONCAT44(in_stack_fffffffffffff3dc,
                                                   in_stack_fffffffffffff3d8));
                core::array<irr::core::vector3d<float>_>::push_back
                          ((array<irr::core::vector3d<float>_> *)
                           CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                           (vector3d<float> *)
                           CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
              }
              else if (cVar1 == 'n') {
                core::vector3d<float>::vector3d(&local_380);
                local_d0 = (SObjMtl *)
                           readVec3((COBJMeshFileLoader *)in_stack_fffffffffffff3f0._M_node,
                                    (c8 *)CONCAT71(in_stack_fffffffffffff3e9,
                                                   in_stack_fffffffffffff3e8),
                                    (vector3df *)in_stack_fffffffffffff3e0._M_node,
                                    (c8 *)CONCAT44(in_stack_fffffffffffff3dc,
                                                   in_stack_fffffffffffff3d8));
                core::array<irr::core::vector3d<float>_>::push_back
                          ((array<irr::core::vector3d<float>_> *)
                           CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                           (vector3d<float> *)
                           CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
              }
              else if (cVar1 == 't') {
                core::vector2d<float>::vector2d(&local_388);
                local_d0 = (SObjMtl *)
                           readUV((COBJMeshFileLoader *)in_stack_fffffffffffff3f0._M_node,
                                  (c8 *)CONCAT71(in_stack_fffffffffffff3e9,in_stack_fffffffffffff3e8
                                                ),(vector2df *)in_stack_fffffffffffff3e0._M_node,
                                  (c8 *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8
                                                ));
                core::array<irr::core::vector2d<float>_>::push_back
                          ((array<irr::core::vector2d<float>_> *)
                           CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                           (vector2d<float> *)
                           CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
              }
            }
          }
        }
        local_d0 = (SObjMtl *)
                   goNextLine((COBJMeshFileLoader *)in_stack_fffffffffffff2e0,
                              (c8 *)in_stack_fffffffffffff2d8,
                              (c8 *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
        local_118 = local_118 + 1;
      }
      if (local_15c != 0) {
        core::string<char>::string
                  ((string<char> *)in_stack_fffffffffffff2f0,
                   (uint)((ulong)in_stack_fffffffffffff2e8 >> 0x20));
        core::string<char>::operator+=
                  ((string<char> *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                   (char *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
        core::string<char>::string
                  ((string<char> *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                   (string<char> *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
        core::string<char>::operator+=
                  ((string<char> *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                   (string<char> *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
        core::string<char>::~string((string<char> *)0x2d96a7);
        this_00 = (Printer *)core::string<char>::c_str((string<char> *)0x2d96b4);
        os::Printer::log(this_00,__x_01);
        core::string<char>::~string((string<char> *)0x2d96ce);
      }
      puVar13 = (undefined8 *)operator_new(0x58);
      SMesh::SMesh((SMesh *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
      local_c84 = 0;
      while (uVar16 = local_c84,
            uVar4 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::size
                              ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)0x2d9719),
            uVar16 < uVar4) {
        ppSVar14 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
                             ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)
                              CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                              in_stack_fffffffffffff2cc);
        iVar5 = (*((*ppSVar14)->Meshbuffer->super_IMeshBuffer)._vptr_IMeshBuffer[9])();
        if (iVar5 != 0) {
          ppSVar14 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
                               ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)
                                CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                in_stack_fffffffffffff2cc);
          (*((*ppSVar14)->Meshbuffer->super_IMeshBuffer)._vptr_IMeshBuffer[0xc])();
          ppSVar14 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
                               ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)
                                CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                in_stack_fffffffffffff2cc);
          if (((*ppSVar14)->RecalculateNormals & 1U) != 0) {
            plVar7 = (long *)(**(code **)(**(long **)(in_RDI + 8) + 0xb8))();
            ppSVar14 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
                                 ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)
                                  CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                  in_stack_fffffffffffff2cc);
            (**(code **)(*plVar7 + 8))(plVar7,(*ppSVar14)->Meshbuffer,0);
          }
          core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
                    ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)
                     CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                     in_stack_fffffffffffff2cc);
          SMesh::addMeshBuffer
                    ((SMesh *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                     (IMeshBuffer *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
        }
        local_c84 = local_c84 + 1;
      }
      local_c90 = (SAnimatedMesh *)0x0;
      iVar5 = (**(code **)*puVar13)();
      if (iVar5 != 0) {
        SMesh::recalculateBoundingBox((SMesh *)in_stack_fffffffffffff2e0);
        local_c90 = (SAnimatedMesh *)operator_new(0x60);
        SAnimatedMesh::SAnimatedMesh
                  (local_c90,(IMesh *)in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d4);
        local_c90->Type = EAMT_OBJ;
        in_stack_fffffffffffff2e0 = local_c90;
        SAnimatedMesh::addMesh
                  ((SAnimatedMesh *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                   (IMesh *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
        SAnimatedMesh::recalculateBoundingBox(in_stack_fffffffffffff2e0);
      }
      if (local_c0 != (SObjMtl *)0x0) {
        operator_delete__(local_c0);
      }
      cleanUp((COBJMeshFileLoader *)in_stack_fffffffffffff2e0);
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8))
      ;
      local_8 = local_c90;
      local_bfc = 1;
LAB_002d9913:
      core::string<char>::~string((string<char> *)0x2d9920);
      core::array<int>::~array((array<int> *)0x2d992d);
      core::string<char>::~string((string<char> *)0x2d993a);
      core::string<char>::~string((string<char> *)0x2d9947);
      core::string<char>::~string((string<char> *)0x2d9954);
      core::array<irr::core::vector2d<float>_>::~array
                ((array<irr::core::vector2d<float>_> *)0x2d9961);
      core::array<irr::core::vector3d<float>_>::~array
                ((array<irr::core::vector3d<float>_> *)0x2d996e);
      core::array<irr::core::vector3d<float>_>::~array
                ((array<irr::core::vector3d<float>_> *)0x2d997b);
    }
  }
  return (IAnimatedMesh *)local_8;
}

Assistant:

IAnimatedMesh *COBJMeshFileLoader::createMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

	const long filesize = file->getSize();
	if (!filesize)
		return 0;

	const u32 WORD_BUFFER_LENGTH = 512;

	core::array<core::vector3df> vertexBuffer(1000);
	core::array<core::vector3df> normalsBuffer(1000);
	core::array<core::vector2df> textureCoordBuffer(1000);

	SObjMtl *currMtl = new SObjMtl();
	Materials.push_back(currMtl);
	u32 smoothingGroup = 0;

	const io::path fullName = file->getFileName();

	c8 *buf = new c8[filesize + 1]; // plus null-terminator
	memset(buf, 0, filesize + 1);
	file->read((void *)buf, filesize);
	const c8 *const bufEnd = buf + filesize;

	// Process obj information
	const c8 *bufPtr = buf;
	core::stringc grpName, mtlName;
	bool mtlChanged = false;
	bool useGroups = !SceneManager->getParameters()->getAttributeAsBool(OBJ_LOADER_IGNORE_GROUPS);
	bool useMaterials = !SceneManager->getParameters()->getAttributeAsBool(OBJ_LOADER_IGNORE_MATERIAL_FILES);
	[[maybe_unused]] irr::u32 lineNr = 1; // only counts non-empty lines, still useful in debugging to locate errors
	core::array<int> faceCorners;
	faceCorners.reallocate(32); // should be large enough
	const core::stringc TAG_OFF = "off";
	irr::u32 degeneratedFaces = 0;

	while (bufPtr != bufEnd) {
		switch (bufPtr[0]) {
		case 'm': // mtllib (material)
		{
			if (useMaterials) {
				c8 name[WORD_BUFFER_LENGTH];
				bufPtr = goAndCopyNextWord(name, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
				os::Printer::log("Ignoring material file", name);
#endif
			}
		} break;

		case 'v': // v, vn, vt
			switch (bufPtr[1]) {
			case ' ': // vertex
			{
				core::vector3df vec;
				bufPtr = readVec3(bufPtr, vec, bufEnd);
				vertexBuffer.push_back(vec);
			} break;

			case 'n': // normal
			{
				core::vector3df vec;
				bufPtr = readVec3(bufPtr, vec, bufEnd);
				normalsBuffer.push_back(vec);
			} break;

			case 't': // texcoord
			{
				core::vector2df vec;
				bufPtr = readUV(bufPtr, vec, bufEnd);
				textureCoordBuffer.push_back(vec);
			} break;
			}
			break;

		case 'g': // group name
		{
			c8 grp[WORD_BUFFER_LENGTH];
			bufPtr = goAndCopyNextWord(grp, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
			os::Printer::log("Loaded group start", grp, ELL_DEBUG);
#endif
			if (useGroups) {
				if (0 != grp[0])
					grpName = grp;
				else
					grpName = "default";
			}
			mtlChanged = true;
		} break;

		case 's': // smoothing can be a group or off (equiv. to 0)
		{
			c8 smooth[WORD_BUFFER_LENGTH];
			bufPtr = goAndCopyNextWord(smooth, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
			os::Printer::log("Loaded smoothing group start", smooth, ELL_DEBUG);
#endif
			if (TAG_OFF == smooth)
				smoothingGroup = 0;
			else
				smoothingGroup = core::strtoul10(smooth);

			(void)smoothingGroup; // disable unused variable warnings
		} break;

		case 'u': // usemtl
			// get name of material
			{
				c8 matName[WORD_BUFFER_LENGTH];
				bufPtr = goAndCopyNextWord(matName, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
				os::Printer::log("Loaded material start", matName, ELL_DEBUG);
#endif
				mtlName = matName;
				mtlChanged = true;
			}
			break;

		case 'f': // face
		{
			c8 vertexWord[WORD_BUFFER_LENGTH]; // for retrieving vertex data
			video::S3DVertex v;
			// Assign vertex color from currently active material's diffuse color
			if (mtlChanged) {
				// retrieve the material
				SObjMtl *useMtl = findMtl(mtlName, grpName);
				// only change material if we found it
				if (useMtl)
					currMtl = useMtl;
				mtlChanged = false;
			}
			if (currMtl)
				v.Color = currMtl->Meshbuffer->Material.DiffuseColor;

			// get all vertices data in this face (current line of obj file)
			const core::stringc wordBuffer = copyLine(bufPtr, bufEnd);
			const c8 *linePtr = wordBuffer.c_str();
			const c8 *const endPtr = linePtr + wordBuffer.size();

			faceCorners.set_used(0); // fast clear

			// read in all vertices
			linePtr = goNextWord(linePtr, endPtr);
			while (0 != linePtr[0]) {
				// Array to communicate with retrieveVertexIndices()
				// sends the buffer sizes and gets the actual indices
				// if index not set returns -1
				s32 Idx[3];
				Idx[0] = Idx[1] = Idx[2] = -1;

				// read in next vertex's data
				u32 wlength = copyWord(vertexWord, linePtr, WORD_BUFFER_LENGTH, endPtr);
				// this function will also convert obj's 1-based index to c++'s 0-based index
				retrieveVertexIndices(vertexWord, Idx, vertexWord + wlength + 1, vertexBuffer.size(), textureCoordBuffer.size(), normalsBuffer.size());
				if (Idx[0] >= 0 && Idx[0] < (irr::s32)vertexBuffer.size())
					v.Pos = vertexBuffer[Idx[0]];
				else {
					os::Printer::log("Invalid vertex index in this line", wordBuffer.c_str(), ELL_ERROR);
					delete[] buf;
					cleanUp();
					return 0;
				}
				if (Idx[1] >= 0 && Idx[1] < (irr::s32)textureCoordBuffer.size())
					v.TCoords = textureCoordBuffer[Idx[1]];
				else
					v.TCoords.set(0.0f, 0.0f);
				if (Idx[2] >= 0 && Idx[2] < (irr::s32)normalsBuffer.size())
					v.Normal = normalsBuffer[Idx[2]];
				else {
					v.Normal.set(0.0f, 0.0f, 0.0f);
					currMtl->RecalculateNormals = true;
				}

				int vertLocation;
				auto n = currMtl->VertMap.find(v);
				if (n != currMtl->VertMap.end()) {
					vertLocation = n->second;
				} else {
					currMtl->Meshbuffer->Vertices.push_back(v);
					vertLocation = currMtl->Meshbuffer->Vertices.size() - 1;
					currMtl->VertMap.emplace(v, vertLocation);
				}

				faceCorners.push_back(vertLocation);

				// go to next vertex
				linePtr = goNextWord(linePtr, endPtr);
			}

			if (faceCorners.size() < 3) {
				os::Printer::log("Too few vertices in this line", wordBuffer.c_str(), ELL_ERROR);
				delete[] buf;
				cleanUp();
				return 0;
			}

			// triangulate the face
			const int c = faceCorners[0];
			for (u32 i = 1; i < faceCorners.size() - 1; ++i) {
				// Add a triangle
				const int a = faceCorners[i + 1];
				const int b = faceCorners[i];
				if (a != b && a != c && b != c) { // ignore degenerated faces. We can get them when we merge vertices above in the VertMap.
					currMtl->Meshbuffer->Indices.push_back(a);
					currMtl->Meshbuffer->Indices.push_back(b);
					currMtl->Meshbuffer->Indices.push_back(c);
				} else {
					++degeneratedFaces;
				}
			}
		} break;

		case '#': // comment
		default:
			break;
		} // end switch(bufPtr[0])
		// eat up rest of line
		bufPtr = goNextLine(bufPtr, bufEnd);
		++lineNr;
	} // end while(bufPtr && (bufPtr-buf<filesize))

	if (degeneratedFaces > 0) {
		irr::core::stringc log(degeneratedFaces);
		log += " degenerated faces removed in ";
		log += irr::core::stringc(fullName);
		os::Printer::log(log.c_str(), ELL_INFORMATION);
	}

	SMesh *mesh = new SMesh();

	// Combine all the groups (meshbuffers) into the mesh
	for (u32 m = 0; m < Materials.size(); ++m) {
		if (Materials[m]->Meshbuffer->getIndexCount() > 0) {
			Materials[m]->Meshbuffer->recalculateBoundingBox();
			if (Materials[m]->RecalculateNormals)
				SceneManager->getMeshManipulator()->recalculateNormals(Materials[m]->Meshbuffer);
			mesh->addMeshBuffer(Materials[m]->Meshbuffer);
		}
	}

	// Create the Animated mesh if there's anything in the mesh
	SAnimatedMesh *animMesh = 0;
	if (0 != mesh->getMeshBufferCount()) {
		mesh->recalculateBoundingBox();
		animMesh = new SAnimatedMesh();
		animMesh->Type = EAMT_OBJ;
		animMesh->addMesh(mesh);
		animMesh->recalculateBoundingBox();
	}

	// Clean up the allocate obj file contents
	delete[] buf;
	// more cleaning up
	cleanUp();
	mesh->drop();

	return animMesh;
}